

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contains.hpp
# Opt level: O0

bool linq::Contains<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>,int>
               (ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int> *source,int *item)

{
  bool bVar1;
  int iVar2;
  int *item_local;
  ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int> *source_local;
  
  ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>::Init(source);
  while( true ) {
    bVar1 = ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>::Valid(source);
    if (!bVar1) {
      return false;
    }
    iVar2 = ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>::Current(source);
    if (iVar2 == *item) break;
    ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>::Advance(source);
  }
  return true;
}

Assistant:

bool Contains(S&& source, const T& item)
	{
		for(source.Init() ; source.Valid() ; source.Advance())
			if(source.Current() == item)
				return true;

		return false;
	}